

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  char *p;
  int iVar1;
  uchar *z;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  uchar *puVar4;
  int token;
  uchar *local_68;
  int local_5c;
  char *local_58;
  sqlite3_context *local_50;
  char *local_48;
  char *local_40;
  void *local_38;
  
  db = context->pOut->db;
  z = (uchar *)sqlite3ValueText(*argv,'\x01');
  pcVar2 = (char *)sqlite3ValueText(argv[1],'\x01');
  local_38 = sqlite3ValueText(argv[2],'\x01');
  if (pcVar2 == (char *)0x0 || z == (uchar *)0x0) {
    return;
  }
  local_68 = z;
  local_50 = context;
  if (*z == '\0') {
    local_58 = (char *)0x0;
  }
  else {
    local_58 = (char *)0x0;
    local_48 = pcVar2;
    do {
      iVar1 = sqlite3GetToken(z,&local_5c);
      if (local_5c == 0x69) {
        do {
          puVar4 = z;
          z = puVar4 + iVar1;
          iVar1 = sqlite3GetToken(z,&local_5c);
        } while (local_5c == 0x97);
        if (puVar4 == (uchar *)0x0) break;
        __n = (size_t)iVar1;
        pcVar3 = (char *)sqlite3DbMallocRaw(db,__n + 1);
        if (pcVar3 == (char *)0x0) break;
        memcpy(pcVar3,z,__n);
        pcVar3[__n] = '\0';
        sqlite3Dequote(pcVar3);
        iVar1 = sqlite3_stricmp(pcVar2,pcVar3);
        p = local_58;
        if (iVar1 == 0) {
          pcVar2 = local_58;
          if (local_58 == (char *)0x0) {
            pcVar2 = "";
          }
          local_40 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar2,(ulong)(uint)((int)z - (int)local_68),
                                    local_68,local_38);
          sqlite3DbFree(db,p);
          local_68 = z + __n;
          local_58 = local_40;
          pcVar2 = local_48;
        }
        sqlite3DbFree(db,pcVar3);
      }
      else {
        __n = (size_t)iVar1;
      }
      puVar4 = z + __n;
      z = z + __n;
    } while (*puVar4 != '\0');
  }
  pcVar2 = local_58;
  pcVar3 = "";
  if (local_58 != (char *)0x0) {
    pcVar3 = local_58;
  }
  pcVar3 = sqlite3MPrintf(db,"%s%s",pcVar3,local_68);
  setResultStrOrError(local_50,pcVar3,-1,'\x01',sqlite3MallocSize);
  sqlite3DbFree(db,pcVar2);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}